

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateLimiterTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::utils::RateLimiter_testMaxBalance_Test::~RateLimiter_testMaxBalance_Test
          (RateLimiter_testMaxBalance_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(RateLimiter, testMaxBalance)
{
    const auto timestamp = std::chrono::steady_clock::now();
    currentTime = timestamp;
    RateLimiter<MockClock> limiter(0.1, 1.0);

    ASSERT_TRUE(limiter.checkCredit(1.0));

    currentTime = timestamp + std::chrono::seconds(20);
    ASSERT_TRUE(limiter.checkCredit(1.0));
    ASSERT_FALSE(limiter.checkCredit(1.0));
}